

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_distribution.cpp
# Opt level: O0

void __thiscall
MxxDistribution_StableScatterBlockDistr_Test::MxxDistribution_StableScatterBlockDistr_Test
          (MxxDistribution_StableScatterBlockDistr_Test *this)

{
  MxxDistribution_StableScatterBlockDistr_Test *this_local;
  
  testing::Test::Test(&this->super_Test);
  (this->super_Test)._vptr_Test =
       (_func_int **)&PTR__MxxDistribution_StableScatterBlockDistr_Test_001ddda8;
  return;
}

Assistant:

TEST(MxxDistribution, StableScatterBlockDistr) {
    mxx::comm c;
    std::basic_string<unsigned char> vec;
    size_t size = 40;
    if (c.rank() == c.size() / 2) {
        vec.resize(size);
        for (size_t i = 0; i < size; ++i) {
            vec[i] = static_cast<unsigned char>(i % 256);
        }
    }
    // test non-inplace
    std::basic_string<unsigned char> x = mxx::stable_distribute(vec, c);
    // test inplace
    mxx::stable_distribute_inplace(vec, c);

    size_t eq_size = size / c.size();
    if ((size_t)c.rank() < size % c.size())
        eq_size+=1;
    size_t prefix = mxx::exscan(eq_size, c);

    ASSERT_EQ(eq_size, x.size());
    ASSERT_EQ(eq_size, vec.size());

    for (size_t i = 0; i < eq_size; ++i) {
        ASSERT_EQ(static_cast<unsigned char>((prefix + i) % 256), x[i]);
        ASSERT_EQ(static_cast<unsigned char>((prefix + i) % 256), vec[i]);
    }
}